

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O3

SUNErrCode SUNAdaptController_Write_ImExGus(SUNAdaptController C,FILE *fptr)

{
  fwrite("ImEx Gustafsson SUNAdaptController module:\n",0x2b,1,(FILE *)fptr);
  fprintf((FILE *)fptr,"  k1e = %.15g\n",*(undefined8 *)((long)C->content + 0x10));
  fprintf((FILE *)fptr,"  k2e = %.15g\n",*(undefined8 *)((long)C->content + 0x18));
  fprintf((FILE *)fptr,"  k1i = %.15g\n",*C->content);
  fprintf((FILE *)fptr,"  k2i = %.15g\n",*(undefined8 *)((long)C->content + 8));
  fprintf((FILE *)fptr,"  bias factor = %.15g\n",*(undefined8 *)((long)C->content + 0x20));
  fprintf((FILE *)fptr,"  previous error = %.15g\n",*(undefined8 *)((long)C->content + 0x28));
  fprintf((FILE *)fptr,"  previous step = %.15g\n",*(undefined8 *)((long)C->content + 0x30));
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Write_ImExGus(SUNAdaptController C, FILE* fptr)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(fptr, SUN_ERR_ARG_CORRUPT);
  fprintf(fptr, "ImEx Gustafsson SUNAdaptController module:\n");
  fprintf(fptr, "  k1e = " SUN_FORMAT_G "\n", SACIMEXGUS_K1E(C));
  fprintf(fptr, "  k2e = " SUN_FORMAT_G "\n", SACIMEXGUS_K2E(C));
  fprintf(fptr, "  k1i = " SUN_FORMAT_G "\n", SACIMEXGUS_K1I(C));
  fprintf(fptr, "  k2i = " SUN_FORMAT_G "\n", SACIMEXGUS_K2I(C));
  fprintf(fptr, "  bias factor = " SUN_FORMAT_G "\n", SACIMEXGUS_BIAS(C));
  fprintf(fptr, "  previous error = " SUN_FORMAT_G "\n", SACIMEXGUS_EP(C));
  fprintf(fptr, "  previous step = " SUN_FORMAT_G "\n", SACIMEXGUS_HP(C));
  return SUN_SUCCESS;
}